

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slicing.h
# Opt level: O1

void __thiscall
dg::WalkAndMark<dg::LLVMNode>::markSlice(WalkAndMark<dg::LLVMNode> *this,LLVMNode *n,WalkData *data)

{
  uint uVar1;
  _Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
  *this_00;
  long lVar2;
  long *plVar3;
  NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_> *this_01;
  _Rb_tree_node_base *p_Var4;
  BBlockContainerT *pBVar5;
  WalkAndMark<dg::LLVMNode> *pWVar6;
  undefined8 *puVar7;
  pair<std::_Rb_tree_iterator<dg::BBlock<dg::LLVMNode>_*>,_bool> pVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  BBlock<dg::LLVMNode> *B;
  BBlock<dg::LLVMNode> *local_38;
  
  uVar1 = *(uint *)&(n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).key;
  *(uint *)&this[2].markedBlocks._M_t._M_impl = uVar1;
  local_38 = *(BBlock<dg::LLVMNode> **)
              &this[2].markedBlocks._M_t._M_impl.super__Rb_tree_header._M_header;
  if (local_38 != (BBlock<dg::LLVMNode> *)0x0) {
    local_38->slice_id = (ulong)uVar1;
    this_00 = *(_Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                **)&(n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                    controlDepEdges.super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl;
    if (this_00 !=
        (_Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
         *)0x0) {
      pVar8 = std::
              _Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
              ::_M_insert_unique<dg::BBlock<dg::LLVMNode>*const&>(this_00,&local_38);
      data = pVar8._8_8_;
    }
    if ((n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).dg[0x70] ==
        (LLVMDependenceGraph)0x1) {
      auVar9._8_8_ = data;
      auVar9._0_8_ = ((iterator *)
                     ((long)&(this->
                             super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>).
                             queue.Container.c.
                             super__Deque_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>.
                             _M_impl.super__Deque_impl_data + 0x10))->_M_cur;
      while (data = auVar9._8_8_, p_Var4 = auVar9._0_8_,
            p_Var4 != (_Rb_tree_node_base *)
                      &(this->super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>).
                       queue) {
        legacy::NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>::enqueue
                  ((NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_> *)
                   (n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).dg,
                   *(LLVMNode **)(p_Var4 + 1));
        auVar9 = std::_Rb_tree_increment(p_Var4);
      }
      if ((local_38->nodes).super__List_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>.
          _M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&local_38->nodes) {
        pWVar6 = (WalkAndMark<dg::LLVMNode> *)0x0;
      }
      else {
        pWVar6 = (WalkAndMark<dg::LLVMNode> *)
                 (local_38->nodes).super__List_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>
                 ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
      }
      if (pWVar6 == this) {
        auVar10._8_8_ = data;
        auVar10._0_8_ =
             *(_Base_ptr *)
              ((long)&(local_38->controlDeps).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.
                      container._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
        pBVar5 = &local_38->controlDeps;
        while (data = auVar10._8_8_, p_Var4 = auVar10._0_8_,
              (_Rb_tree_header *)p_Var4 !=
              &(pBVar5->super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>).container._M_t._M_impl.
               super__Rb_tree_header) {
          lVar2 = *(long *)(p_Var4 + 1);
          for (puVar7 = *(undefined8 **)(lVar2 + 0x10); puVar7 != (undefined8 *)(lVar2 + 0x10);
              puVar7 = (undefined8 *)*puVar7) {
            legacy::NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>::enqueue
                      ((NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_> *)
                       (n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).dg,
                       (LLVMNode *)puVar7[2]);
          }
          auVar10 = std::_Rb_tree_increment(p_Var4);
        }
      }
    }
  }
  plVar3 = (long *)(this->super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>).
                   super_NodesWalkBase<dg::LLVMNode>.super_Analysis<dg::LLVMNode>.statistics.
                   processedBlocks;
  if (plVar3 != (long *)0x0) {
    (**(code **)(*plVar3 + 0x10))(plVar3,(ulong)uVar1,data);
    this_01 = (NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_> *)
              (n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).dg;
    if (*(char *)&this_01[1]._vptr_NodesWalk == '\0') {
      legacy::NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>::enqueue
                (this_01,(LLVMNode *)plVar3[3]);
    }
  }
  return;
}

Assistant:

static void markSlice(NodeT *n, WalkData *data) {
        uint32_t slice_id = data->slice_id;
        n->setSlice(slice_id);

#ifdef ENABLE_CFG
        // when we marked a node, we need to mark even
        // the basic block - if there are basic blocks
        if (BBlock<NodeT> *B = n->getBBlock()) {
            B->setSlice(slice_id);
            if (data->markedBlocks) {
                data->markedBlocks->insert(B);
            }

            // if this node has CDs, enque them
            if (data->analysis->isForward()) {
                for (auto it = n->control_begin(), et = n->control_end();
                     it != et; ++it) {
                    data->analysis->enqueue(*it);
                }

                // if this node is a jump instruction,
                // add also nodes that control depend on this jump
                if (n == B->getLastNode()) {
                    for (BBlock<NodeT> *CD : B->controlDependence()) {
                        for (auto *cdnd : CD->getNodes()) {
                            data->analysis->enqueue(cdnd);
                        }
                    }
                }
            }
        }
#endif

        // the same with dependence graph, if we keep a node from
        // a dependence graph, we need to keep the dependence graph
        if (DependenceGraph<NodeT> *dg = n->getDG()) {
            dg->setSlice(slice_id);
            if (!data->analysis->isForward()) {
                // and keep also all call-sites of this func (they are
                // control dependent on the entry node)
                // This is correct but not so precise - fix it later.
                // Now I need the correctness...
                NodeT *entry = dg->getEntry();
                assert(entry && "No entry node in dg");
                data->analysis->enqueue(entry);
            }
        }
    }